

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

double fitted(reg_object obj,double *inp,double *varcovar,double *var)

{
  double dVar1;
  int n;
  double *C;
  double *A;
  double *B;
  double *C_00;
  double *temp;
  double *b;
  double *x0;
  double *y;
  double oup;
  int p;
  int i;
  double *var_local;
  double *varcovar_local;
  double *inp_local;
  reg_object obj_local;
  
  n = obj->p;
  C = (double *)malloc(8);
  A = (double *)malloc((long)n << 3);
  B = (double *)malloc((long)n << 3);
  C_00 = (double *)malloc((long)n << 3);
  if (obj->intercept == 1) {
    *A = 1.0;
    *B = obj->beta[0].value;
    for (oup._4_4_ = 1; oup._4_4_ < n; oup._4_4_ = oup._4_4_ + 1) {
      A[oup._4_4_] = inp[oup._4_4_ + -1];
      B[oup._4_4_] = obj->beta[oup._4_4_].value;
    }
  }
  else {
    for (oup._4_4_ = 0; oup._4_4_ < n; oup._4_4_ = oup._4_4_ + 1) {
      A[oup._4_4_] = inp[oup._4_4_];
      B[oup._4_4_] = obj->beta[oup._4_4_].value;
    }
  }
  mmult(A,B,C,1,n,1);
  dVar1 = *C;
  mmult(A,varcovar,C_00,1,n,n);
  mmult(C_00,A,C,1,n,1);
  *var = *C;
  var[1] = obj->sigma + *var;
  free(C_00);
  free(C);
  free(A);
  free(B);
  return dVar1;
}

Assistant:

double fitted(reg_object obj, double *inp, double *varcovar, double *var) {
	int i, p;
	double oup;
	double *y, *x0, *b, *temp;
	/*
	* The function predicts output value at a given input point (vector of size p-1)
	*
	* inp - ia a  vector of length p-1 values corresponding to each of the p-1
	* dependent variables.
	* The function returns output value corresponding to the input inp vector of length (p-1).
	*
	* varcovar - Is the Aurovariance-Covariance matrix that is obtained from the regression function
	* var - is a vector of length 2 where
	* var[0] - Variance of Mean Prediction
	* var[1] - Variance Of Individual Prediction
	*
	*/
	p = obj->p;
	y = (double*)malloc(sizeof(double) * 1);
	x0 = (double*)malloc(sizeof(double) * p);
	b = (double*)malloc(sizeof(double) * p);
	temp = (double*)malloc(sizeof(double) * p);

	if (obj->intercept == 1) {
		x0[0] = 1.0;

		b[0] = (obj->beta)->value;

		for (i = 1; i < p; ++i) {
			x0[i] = inp[i - 1];
			b[i] = (obj->beta + i)->value;
		}
	}
	else {

		for (i = 0; i < p; ++i) {
			x0[i] = inp[i];
			b[i] = (obj->beta + i)->value;
		}
	}


	// Output
	mmult(x0, b, y, 1, p, 1);
	oup = *y;

	// Variance Of Mean Prediction
	mmult(x0, varcovar, temp, 1, p, p);
	mmult(temp, x0, y, 1, p, 1);
	var[0] = *y;

	// Variance Of Individual prediction
	var[1] = obj->sigma + var[0];

	free(temp);
	free(y);
	free(x0);
	free(b);
	return oup;
}